

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvc.c
# Opt level: O1

int cvcMain(int argc,char **argv)

{
  char **ppcVar1;
  bool bVar2;
  int iVar3;
  err_t code;
  bool_t bVar4;
  octet *poVar5;
  size_t sVar6;
  long lVar7;
  octet *certa;
  char *pcVar8;
  octet *poVar9;
  btok_cvc_t *src;
  btok_cvc_t *pbVar10;
  int count;
  octet date [6];
  int readc;
  size_t certa_len;
  size_t req_len;
  char **local_190;
  btok_cvc_t *local_188;
  bool_t eid;
  int readc_1;
  size_t local_170;
  int readc_2;
  bool_t esign;
  octet *local_160;
  btok_cvc_t cvc0 [1];
  
  if (argc < 2) {
    printf("bee2cmd/%s: %s\nUsage:\n  cvc root [options] <privkeya> <certa>\n    issue self-signed certificate <certa>\n  cvc req [options] <privkey> <req>\n    generate pre-certificate <req>\n  cvc iss [options] <privkeya> <certa> <req> <cert>\n    issue <cert> based on <req> and subordinate to <certa>\n  cvc shorten [options] <privkeya> <certa> <cert>\n    shorten the lifetime of <cert> subordinate to <certa>\n  cvc val [options] <certa> <certb> ... <cert>\n    validate <certb> ... <cert> using <certa> as an anchor\n  cvc match [options] <privkey> <cert>\n    check the match between <privkey> and <cert>\n  cvc extr <cert> <pubkey>\n    extract <pubkey> from <cert>\n  cvc print [field] <cert>\n    print <cert> info: all fields or a specific field\n  .\n  <privkey>, <privkeya>\n    containers with private keys\n  <pubkey>\n    file with public key\n  options:\n    -authority <name> -- authority       [root] req\n    -holder <name> -- holder             [root] req [iss]\n    -from <YYMMDD> -- starting date      root req [iss]\n    -until <YYMMDD> -- expiration date   root req [iss] cut\n    -eid <10*hex> -- eId access mask     [root] [req] [iss]\n    -esign <4*hex> -- eSign access mask  [root] [req] [iss]\n    -pass <schema> -- password           root req iss shorten match\n    -date <YYMMDD> -- validation date    [val]\n  field:\n    {-authority|-holder|-from|-until|-eid|-esign|-pubkey|-sig}\n"
           ,"cvc","manage CV-certificates");
    return -1;
  }
  iVar3 = strCmp(argv[1],"root");
  if (iVar3 == 0) {
    code = cmdStDo(8);
    if (code != 0) goto LAB_001096d4;
    code = cvcParseOptions(cvc0,(bool_t *)&req_len,&readc_1,(cmd_pwd_t *)date,(octet *)0x0,&eid,
                           argc + -2,argv + 2);
    if (code != 0) goto LAB_001096d4;
    if ((argc + -2) - eid != 2) {
LAB_001095f1:
      cmdPwdClose(_date);
      code = 0x25b;
      goto LAB_001096d4;
    }
    sVar6 = strLen(cvc0[0].authority);
    pcVar8 = cvc0[0].holder;
    if (sVar6 == 0) {
      pbVar10 = cvc0;
      src = (btok_cvc_t *)pcVar8;
LAB_00109741:
      strCopy(pbVar10->authority,src->authority);
    }
    else {
      sVar6 = strLen(pcVar8);
      if (sVar6 == 0) {
        src = cvc0;
        pbVar10 = (btok_cvc_t *)pcVar8;
        goto LAB_00109741;
      }
    }
    iVar3 = strCmp(cvc0[0].authority,cvc0[0].holder);
    if (iVar3 != 0) {
LAB_0010975d:
      cmdPwdClose(_date);
      code = 0x135;
      goto LAB_001096d4;
    }
LAB_0010921b:
    ppcVar1 = argv + (long)eid + 2;
    code = cmdFileValExist(1,ppcVar1);
    if (code != 0) goto LAB_001096d4;
    code = cmdFileValNotExist(1,ppcVar1 + 1);
    if (code != 0) goto LAB_001096d4;
    _readc = 0;
    code = cmdPrivkeyRead((octet *)0x0,(size_t *)&readc,*ppcVar1,_date);
    if (code != 0) goto LAB_001095e2;
    poVar9 = (octet *)blobCreate(_readc);
    if (poVar9 != (octet *)0x0) {
      code = cmdPrivkeyRead(poVar9,(size_t *)0x0,*ppcVar1,_date);
      cmdPwdClose(_date);
      certa = poVar9;
      if ((code == 0) && (code = btokCVCWrap((octet *)0x0,&certa_len,cvc0,poVar9,_readc), code == 0)
         ) {
        poVar5 = (octet *)blobCreate(certa_len);
        if (poVar5 == (octet *)0x0) {
LAB_00109975:
          blobClose(poVar9);
          goto LAB_00109822;
        }
        code = btokCVCWrap(poVar5,(size_t *)0x0,cvc0,poVar9,_readc);
        blobClose(poVar9);
        certa = poVar5;
        if (code == 0) {
          pcVar8 = ppcVar1[1];
LAB_0010931a:
          code = cmdFileWrite(pcVar8,poVar5,certa_len);
        }
      }
LAB_001096a9:
      blobClose(certa);
      goto LAB_001096d4;
    }
LAB_00109818:
    cmdPwdClose(_date);
  }
  else {
    iVar3 = strCmp(argv[1],"req");
    if (iVar3 == 0) {
      code = cmdStDo(8);
      if (code != 0) goto LAB_001096d4;
      code = cvcParseOptions(cvc0,(bool_t *)&req_len,&readc_1,(cmd_pwd_t *)date,(octet *)0x0,&eid,
                             argc + -2,argv + 2);
      if (code != 0) goto LAB_001096d4;
      if ((argc + -2) - eid != 2) goto LAB_001095f1;
      iVar3 = strCmp(cvc0[0].authority,cvc0[0].holder);
      if (iVar3 == 0) goto LAB_0010975d;
      goto LAB_0010921b;
    }
    iVar3 = strCmp(argv[1],"iss");
    if (iVar3 == 0) {
      code = cmdStDo(8);
      if (code != 0) goto LAB_001096d4;
      code = cvcParseOptions(cvc0,&eid,&esign,(cmd_pwd_t *)date,(octet *)0x0,&readc_2,argc + -2,
                             argv + 2);
      if (code != 0) goto LAB_001096d4;
      sVar6 = strLen(cvc0[0].authority);
      if ((sVar6 != 0) || ((argc + -2) - readc_2 != 4)) goto LAB_001095f1;
      ppcVar1 = argv + 2 + readc_2;
      code = cmdFileValExist(3,ppcVar1);
      if (code != 0) goto LAB_001096d4;
      code = cmdFileValNotExist(1,ppcVar1 + 3);
      if (code != 0) goto LAB_001096d4;
      _readc = 0;
      code = cmdPrivkeyRead((octet *)0x0,(size_t *)&readc,*ppcVar1,_date);
      if (code != 0) goto LAB_001095e2;
      poVar9 = (octet *)blobCreate(_readc);
      if (poVar9 != (octet *)0x0) {
        code = cmdPrivkeyRead(poVar9,(size_t *)0x0,*ppcVar1,_date);
        cmdPwdClose(_date);
        certa = poVar9;
        if (((code == 0) && (code = cmdFileReadAll((void *)0x0,&certa_len,ppcVar1[1]), code == 0))
           && (code = cmdFileReadAll((void *)0x0,&req_len,ppcVar1[2]), code == 0)) {
          _readc_1 = req_len + 0x30;
          certa = (octet *)blobCreate(certa_len + req_len * 2 + 0x158);
          if (certa != (octet *)0x0) {
            local_190 = (char **)certa_len;
            local_188 = (btok_cvc_t *)req_len;
            local_170 = _readc_1;
            code = cmdFileReadAll(certa,&certa_len,ppcVar1[1]);
            if (code != 0) {
LAB_00109512:
              blobClose(poVar9);
              goto LAB_001096a9;
            }
            poVar5 = certa + (long)local_190;
            code = cmdFileReadAll(poVar5,&req_len,ppcVar1[2]);
            if (code != 0) goto LAB_00109512;
            local_160 = poVar5 + (long)local_188->authority;
            pbVar10 = (btok_cvc_t *)(local_160 + local_170);
            code = btokCVCUnwrap(pbVar10,poVar5,req_len,pbVar10->pubkey,0);
            if (code != 0) goto LAB_00109512;
            sVar6 = strLen(cvc0[0].holder);
            if (sVar6 != 0) {
              strCopy(pbVar10->holder,cvc0[0].holder);
            }
            bVar4 = memIsZero(cvc0[0].from,6);
            if (bVar4 == 0) {
              memCopy(pbVar10->from,cvc0[0].from,6);
            }
            bVar4 = memIsZero(cvc0[0].until,6);
            if (bVar4 == 0) {
              memCopy(pbVar10->until,cvc0[0].until,6);
            }
            if (eid != 0) {
              lVar7 = 0;
              do {
                ((octet *)((long)local_190 + local_170) + (long)local_188 + (long)certa)
                [lVar7 + 0xb4] =
                     ((octet *)((long)local_190 + local_170) + (long)local_188 + (long)certa)
                     [lVar7 + 0xb4] & cvc0[0].hat_eid[lVar7];
                lVar7 = lVar7 + 1;
              } while (lVar7 != 5);
            }
            if (esign != 0) {
              lVar7 = 0;
              do {
                ((octet *)((long)local_190 + local_170) + (long)local_188 + (long)certa)
                [lVar7 + 0xb9] =
                     ((octet *)((long)local_190 + local_170) + (long)local_188 + (long)certa)
                     [lVar7 + 0xb9] & cvc0[0].hat_esign[lVar7];
                lVar7 = lVar7 + 1;
              } while (lVar7 == 1);
            }
            code = btokCVCIss(local_160,(size_t *)&readc_1,pbVar10,certa,certa_len,poVar9,_readc);
            blobClose(poVar9);
            if (code != 0) goto LAB_001096a9;
            pcVar8 = ppcVar1[3];
            certa_len = _readc_1;
            poVar5 = local_160;
            goto LAB_0010931a;
          }
          goto LAB_00109975;
        }
        goto LAB_001096a9;
      }
      goto LAB_00109818;
    }
    iVar3 = strCmp(argv[1],"shorten");
    if (iVar3 == 0) {
      code = cmdStDo(8);
      if (code != 0) goto LAB_001096d4;
      code = cvcParseOptions(cvc0,(bool_t *)0x0,(bool_t *)0x0,(cmd_pwd_t *)date,(octet *)0x0,
                             &readc_1,argc + -2,argv + 2);
      if (code != 0) goto LAB_001096d4;
      sVar6 = strLen(cvc0[0].authority);
      if (((sVar6 == 0) && (sVar6 = strLen(cvc0[0].holder), sVar6 == 0)) &&
         ((bVar4 = memIsZero(cvc0[0].from,6), bVar4 != 0 &&
          (bVar4 = memIsZero(cvc0[0].until,6), bVar4 == 0)))) {
        code = 0;
        bVar2 = true;
      }
      else {
        code = 0x25b;
        bVar2 = false;
      }
      if (bVar2) {
        if ((argc + -2) - readc_1 != 3) goto LAB_001095f1;
        ppcVar1 = argv + 2 + readc_1;
        code = cmdFileValExist(3,ppcVar1);
        if (code != 0) goto LAB_001096d4;
        _readc = 0;
        code = cmdPrivkeyRead((octet *)0x0,(size_t *)&readc,*ppcVar1,_date);
        if (code == 0) {
          poVar9 = (octet *)blobCreate(_readc);
          if (poVar9 == (octet *)0x0) goto LAB_00109818;
          code = cmdPrivkeyRead(poVar9,(size_t *)0x0,*ppcVar1,_date);
          cmdPwdClose(_date);
          certa = poVar9;
          if (((code == 0) && (code = cmdFileReadAll((void *)0x0,&certa_len,ppcVar1[1]), code == 0))
             && (code = cmdFileReadAll((void *)0x0,&req_len,ppcVar1[2]), code == 0)) {
            certa = (octet *)blobCreate(certa_len + req_len + 0x128);
            if (certa == (octet *)0x0) goto LAB_00109975;
            local_190 = (char **)(certa + certa_len);
            local_188 = (btok_cvc_t *)(req_len + (long)local_190);
            code = cmdFileReadAll(certa,&certa_len,ppcVar1[1]);
            if (((code == 0) && (code = cmdFileReadAll(local_190,&req_len,ppcVar1[2]), code == 0))
               && ((code = btokCVCVal((octet *)local_190,req_len,certa,certa_len,(octet *)0x0),
                   code == 0 &&
                   (code = btokCVCUnwrap(local_188,(octet *)local_190,req_len,(octet *)0x0,0),
                   code == 0)))) {
              poVar5 = local_188->until;
              iVar3 = memCmp(poVar5,cvc0[0].until,6);
              if (iVar3 < 0) {
                blobClose(poVar9);
                blobClose(certa);
                code = 0x134;
                goto LAB_001096d4;
              }
              memCopy(poVar5,cvc0[0].until,6);
              code = btokCVCIss((octet *)local_190,(size_t *)0x0,local_188,certa,certa_len,poVar9,
                                _readc);
              blobClose(poVar9);
              if (code == 0) {
                code = cmdFileWrite(ppcVar1[2],local_190,req_len);
              }
            }
            else {
              blobClose(poVar9);
            }
          }
          goto LAB_001096a9;
        }
      }
LAB_001095e2:
      cmdPwdClose(_date);
      goto LAB_001096d4;
    }
    iVar3 = strCmp(argv[1],"val");
    if (iVar3 != 0) {
      iVar3 = strCmp(argv[1],"match");
      if (iVar3 == 0) {
        code = cvcMatch(argc + -2,argv + 2);
      }
      else {
        iVar3 = strCmp(argv[1],"extr");
        if (iVar3 == 0) {
          code = cvcExtr(argc + -2,argv + 2);
        }
        else {
          iVar3 = strCmp(argv[1],"print");
          code = 0x259;
          if (iVar3 == 0) {
            code = cvcPrint(argc + -2,argv + 2);
          }
        }
      }
      goto LAB_001096d4;
    }
    code = cmdStDo(8);
    if (code != 0) goto LAB_001096d4;
    code = cvcParseOptions((btok_cvc_t *)0x0,(bool_t *)0x0,(bool_t *)0x0,(cmd_pwd_t *)0x0,date,
                           &readc,argc + -2,argv + 2);
    if (code != 0) goto LAB_001096d4;
    iVar3 = readc;
    lVar7 = (long)readc;
    count = (argc + -2) - readc;
    code = 0x25b;
    if (count < 2) goto LAB_001096d4;
    ppcVar1 = argv + 2 + lVar7;
    code = cmdFileValExist(count,ppcVar1);
    if (code != 0) goto LAB_001096d4;
    certa = (octet *)blobCreate(0x450);
    if (certa != (octet *)0x0) {
      code = cmdFileReadAll((void *)0x0,(size_t *)cvc0,*ppcVar1);
      if (code == 0) {
        if ((ulong)cvc0[0].authority._0_8_ < 0x201) {
          code = cmdFileReadAll(certa,(size_t *)cvc0,*ppcVar1);
          if (code == 0) {
            pbVar10 = (btok_cvc_t *)(certa + 0x200);
            code = btokCVCUnwrap(pbVar10,certa,cvc0[0].authority._0_8_,(octet *)0x0,0);
            if (code == 0) {
              local_188 = (btok_cvc_t *)(certa + 0x328);
              local_170 = (ulong)(uint)(argc - iVar3) - 4;
              local_190 = argv + lVar7 + 3;
              lVar7 = 0;
              do {
                code = cmdFileReadAll((void *)0x0,(size_t *)cvc0,local_190[lVar7]);
                if (code != 0) break;
                if (0x200 < (ulong)cvc0[0].authority._0_8_) goto LAB_00109968;
                code = cmdFileReadAll(certa,(size_t *)cvc0,local_190[lVar7]);
                if (code != 0) break;
                if (((int)local_170 == (int)lVar7) && (bVar4 = memIsZero(date,6), bVar4 == 0)) {
                  poVar9 = date;
                }
                else {
                  poVar9 = (octet *)0x0;
                }
                code = btokCVCVal2(local_188,certa,cvc0[0].authority._0_8_,pbVar10,poVar9);
                if (code != 0) break;
                memCopy(pbVar10,local_188,0x128);
                lVar7 = lVar7 + 1;
                code = 0;
              } while ((argc - iVar3) - 3U != (int)lVar7);
            }
          }
        }
        else {
LAB_00109968:
          code = 0x202;
        }
      }
      goto LAB_001096a9;
    }
  }
LAB_00109822:
  code = 0x6e;
LAB_001096d4:
  if (((code != 0) || (iVar3 = strCmp(argv[1],"val"), iVar3 == 0)) ||
     (iVar3 = strCmp(argv[1],"match"), iVar3 == 0)) {
    pcVar8 = errMsg(code);
    printf("bee2cmd/%s: %s\n","cvc",pcVar8);
  }
  return -(uint)(code != 0);
}

Assistant:

int cvcMain(int argc, char* argv[])
{
	err_t code;
	// справка
	if (argc < 2)
		return cvcUsage();
	// разбор команды
	++argv, --argc;
	if (strEq(argv[0], "root"))
		code = cvcRoot(argc - 1, argv + 1);
	else if (strEq(argv[0], "req"))
		code = cvcReq(argc - 1, argv + 1);
	else if (strEq(argv[0], "iss"))
		code = cvcIss(argc - 1, argv + 1);
	else if (strEq(argv[0], "shorten"))
		code = cvcShorten(argc - 1, argv + 1);
	else if (strEq(argv[0], "val"))
		code = cvcVal(argc - 1, argv + 1);
	else if (strEq(argv[0], "match"))
		code = cvcMatch(argc - 1, argv + 1);
	else if (strEq(argv[0], "extr"))
		code = cvcExtr(argc - 1, argv + 1);
	else if (strEq(argv[0], "print"))
		code = cvcPrint(argc - 1, argv + 1);
	else
		code = ERR_CMD_NOT_FOUND;
	// завершить
	if (code != ERR_OK || strEq(argv[0], "val") || strEq(argv[0], "match"))
		printf("bee2cmd/%s: %s\n", _name, errMsg(code));
	return code != ERR_OK ? -1 : 0;
}